

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

float memory_tree_ns::return_reward_from_node
                (memory_tree *b,single_learner *base,uint32_t cn,example *ec,float weight)

{
  polyprediction *ppVar1;
  uint64_t *puVar2;
  uint32_t uVar3;
  example *peVar4;
  wclass *pwVar5;
  wclass *pwVar6;
  bool bVar7;
  wclass *pwVar8;
  size_t sVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  size_t sVar13;
  node *pnVar14;
  int64_t iVar15;
  polylabel *ppVar16;
  wclass *pwVar17;
  ulong uVar18;
  int iVar19;
  float fVar20;
  labels preds;
  labels multilabels;
  labels preds_1;
  v_array<unsigned_int> leaf_labs;
  float local_10c;
  label_t local_f8;
  float *local_c8;
  float *pfStack_c0;
  float *local_b8;
  size_t sStack_b0;
  label_t local_a8;
  wclass *pwStack_a0;
  wclass *local_98;
  size_t sStack_90;
  v_array<unsigned_int> local_58;
  
  uVar18 = (ulong)cn;
  ppVar16 = &ec->l;
  ppVar1 = &ec->pred;
  if (b->oas == 0) {
    local_f8 = ppVar16->multi;
    fVar20 = ppVar1->scalar;
  }
  else {
    local_a8 = ppVar16->multi;
    pwStack_a0 = (ec->l).cs.costs._end;
    local_98 = (ec->l).cs.costs.end_array;
    sStack_90 = (ec->l).cs.costs.erase_count;
    local_c8 = (ppVar1->scalars)._begin;
    pfStack_c0 = (ec->pred).scalars._end;
    local_b8 = (ec->pred).scalars.end_array;
    sStack_b0 = (ec->pred).scalars.erase_count;
    fVar20 = 0.0;
  }
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar14 = (b->nodes)._begin;
  if (pnVar14[uVar18].internal != -1) {
    pnVar14 = pnVar14 + uVar18;
    do {
      uVar3 = pnVar14->base_router;
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 + (ulong)(*(int *)(base + 0xe0) * uVar3);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 - (ulong)(uVar3 * *(int *)(base + 0xe0));
      pnVar14 = (b->nodes)._begin;
      cn = (&pnVar14[uVar18].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
      uVar18 = (ulong)cn;
      pnVar14 = pnVar14 + uVar18;
    } while (pnVar14->internal != -1);
  }
  if (b->oas == 0) {
    (ec->l).multi = local_f8;
    (ec->pred).scalar = fVar20;
  }
  else {
    (ec->pred).scalars.end_array = local_b8;
    (ec->pred).scalars.erase_count = sStack_b0;
    (ec->pred).scalars._begin = local_c8;
    (ec->pred).scalars._end = pfStack_c0;
    (ec->l).cs.costs.end_array = local_98;
    (ec->l).cs.costs.erase_count = sStack_90;
    ppVar16->multi = local_a8;
    (ec->l).cs.costs._end = pwStack_a0;
  }
  iVar15 = pick_nearest(b,base,cn,ec);
  if (b->oas == 0) {
    local_10c = 0.0;
    if ((iVar15 != -1) && (((b->examples)._begin[iVar15]->l).multi.label == (ppVar16->multi).label))
    {
      local_10c = 1.0;
    }
  }
  else if (iVar15 == -1) {
    local_10c = 0.0;
  }
  else {
    local_10c = F1_score_for_two_examples(ec,(b->examples)._begin[iVar15]);
  }
  b->total_num_queries = b->total_num_queries + 1;
  if ((iVar15 != -1) && (b->learn_at_leaf == 1)) {
    fVar20 = normalized_linear_prod(b,ec,(b->examples)._begin[iVar15]);
    diag_kronecker_product_test(ec,(b->examples)._begin[iVar15],b->kprod_ec,b->oas);
    peVar4 = b->kprod_ec;
    (peVar4->l).simple.label = local_10c;
    (peVar4->l).simple.weight = 1.0;
    (peVar4->l).simple.initial = -fVar20;
    b->kprod_ec->weight = weight;
    peVar4 = b->kprod_ec;
    iVar19 = (int)b->max_routers;
    puVar2 = &(peVar4->super_example_predict).ft_offset;
    *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar19);
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar4);
    puVar2 = &(peVar4->super_example_predict).ft_offset;
    *puVar2 = *puVar2 - (ulong)(uint)(iVar19 * *(int *)(base + 0xe0));
  }
  if (b->oas == 1) {
    local_58.end_array = (uint *)0x0;
    local_58.erase_count = 0;
    local_58._begin = (uint *)0x0;
    local_58._end = (uint *)0x0;
    collect_labels_from_leaf(b,cn,&local_58);
    pwVar5 = (ec->l).cs.costs._begin;
    pwVar6 = (ec->l).cs.costs._end;
    pwVar8 = (ec->l).cs.costs.end_array;
    sVar9 = (ec->l).cs.costs.erase_count;
    pfVar10 = (ec->pred).scalars._begin;
    pfVar11 = (ec->pred).scalars._end;
    pfVar12 = (ec->pred).scalars.end_array;
    sVar13 = (ec->pred).scalars.erase_count;
    (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
    (ec->l).simple.initial = 0.0;
    if (local_58._end != local_58._begin) {
      uVar18 = 0;
      do {
        (ppVar16->multi).label = 0xbf800000;
        bVar7 = pwVar5 != pwVar6;
        if (pwVar5 == pwVar6) {
LAB_001da953:
          if (bVar7) goto LAB_001da958;
        }
        else {
          fVar20 = pwVar5->x;
          pwVar17 = pwVar5;
          while (fVar20 != (float)local_58._begin[uVar18]) {
            pwVar17 = (wclass *)&pwVar17->class_index;
            bVar7 = pwVar17 != pwVar6;
            if (pwVar17 == pwVar6) goto LAB_001da953;
            fVar20 = *(float *)pwVar17;
          }
LAB_001da958:
          (ppVar16->multi).label = 0x3f800000;
        }
        iVar19 = (int)b->max_routers + local_58._begin[uVar18] + 1;
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar19);
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar2 = &(ec->super_example_predict).ft_offset;
        *puVar2 = *puVar2 - (ulong)(uint)(iVar19 * *(int *)(base + 0xe0));
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)local_58._end - (long)local_58._begin >> 2));
    }
    (ec->pred).scalars.end_array = pfVar12;
    (ec->pred).scalars.erase_count = sVar13;
    (ppVar1->scalars)._begin = pfVar10;
    (ec->pred).scalars._end = pfVar11;
    (ec->l).cs.costs._begin = pwVar5;
    (ec->l).cs.costs._end = pwVar6;
    (ec->l).cs.costs.end_array = pwVar8;
    (ec->l).cs.costs.erase_count = sVar9;
  }
  return local_10c;
}

Assistant:

float return_reward_from_node(memory_tree& b, single_learner& base, uint32_t cn, example& ec, float weight = 1.f){
        //example& ec = *b.examples[ec_array_index];
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas ==false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }
	ec.l.simple = {FLT_MAX, 1., 0.0};
        while(b.nodes[cn].internal != -1){
            base.predict(ec, b.nodes[cn].base_router);
            float prediction = ec.pred.scalar;
            cn = prediction < 0 ? b.nodes[cn].left : b.nodes[cn].right;
        }
        
        if(b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }

        //get to leaf now:
	    int64_t closest_ec = 0;
        float reward = 0.f;
        closest_ec = pick_nearest(b, base, cn, ec); //no randomness for picking example.
        if (b.oas == false){
            if ((closest_ec != -1) && (b.examples[closest_ec]->l.multi.label == ec.l.multi.label))
                reward = 1.f;
        }
        else{
            if (closest_ec != -1)
                reward = F1_score_for_two_examples(ec, *b.examples[closest_ec]);
        }
        b.total_num_queries++;

        if (b.learn_at_leaf == true && closest_ec != -1){
        	float score = normalized_linear_prod(b, &ec, b.examples[closest_ec]);
            diag_kronecker_product_test(ec, *b.examples[closest_ec], *b.kprod_ec, b.oas );
         	b.kprod_ec->l.simple = {reward, 1.f, -score};
	    	b.kprod_ec->weight = weight;
            base.learn(*b.kprod_ec, b.max_routers);
        }

        if (b.oas == true)
            train_one_against_some_at_leaf(b,base, cn,ec); ///learn the inference procedure anyway

        return reward;
    }